

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramPipelineStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InfoLogCase::iterate(InfoLogCase *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  ProgramSources *pPVar8;
  undefined4 extraout_var;
  TestLog *pTVar9;
  TestError *this_00;
  GLchar *infoLog;
  char *pcVar10;
  int *params;
  uint *puVar11;
  undefined1 local_71c [8];
  StateQueryMemoryWriteGuard<int> logLen;
  ProgramPipeline pipeline_1;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  ScopedLogSection local_6b0;
  ScopedLogSection superSection;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  GLsizei local_608;
  allocator<char> local_601;
  int written;
  string buf;
  ProgramPipeline pipeline;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  ScopedLogSection local_580;
  ScopedLogSection section_2;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  ScopedLogSection local_500;
  ScopedLogSection section_1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  ScopedLogSection local_4a8;
  ScopedLogSection section;
  string local_498;
  undefined1 local_478 [8];
  ResultCollector result;
  CallLogWrapper gl;
  string local_408;
  ShaderSource local_3e8;
  ProgramSeparable local_3b9;
  ProgramSources local_3b8;
  undefined1 local_2e8 [8];
  ShaderProgram frgProgram;
  string local_210;
  ShaderSource local_1f0;
  ProgramSeparable local_1b1;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram vtxProgram;
  InfoLogCase *this_local;
  
  vtxProgram.m_program.m_info.linkTimeUs = (deUint64)this;
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_1b0);
  glu::ProgramSeparable::ProgramSeparable(&local_1b1,true);
  pPVar8 = glu::ProgramSources::operator<<(&local_1b0,&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,
             "#version 310 es\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)((long)&frgProgram.m_program.m_info.linkTimeUs + 7));
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  pPVar8 = glu::ProgramSources::operator<<(pPVar8,&local_1f0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,pRVar7,pPVar8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&frgProgram.m_program.m_info.linkTimeUs + 7));
  glu::ProgramSources::~ProgramSources(&local_1b0);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_3b8);
  glu::ProgramSeparable::ProgramSeparable(&local_3b9,true);
  pPVar8 = glu::ProgramSources::operator<<(&local_3b8,&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,
             "#version 310 es\nin mediump vec2 v_colorB;\nin mediump vec2 v_colorC;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_colorB.xxyy + v_colorC.yyxy;\n}\n"
             ,(allocator<char> *)&gl.field_0x17);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3e8,&local_408);
  pPVar8 = glu::ProgramSources::operator<<(pPVar8,&local_3e8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2e8,pRVar7,pPVar8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&gl.field_0x17);
  glu::ProgramSources::~ProgramSources(&local_3b8);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar9);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498," // ERROR: ",(allocator<char> *)((long)&section.m_log + 7));
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_478,pTVar9,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"VtxProg",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"Vertex program",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_4a8,pTVar9,&local_4c8,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar9,(ShaderProgram *)local_e0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_4a8);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"FrgProg",&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"Fragment program",&local_549);
  tcu::ScopedLogSection::ScopedLogSection(&local_500,pTVar9,&local_520,&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar9,(ShaderProgram *)local_2e8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_500);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if ((bVar2) && (bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_2e8), bVar2)) {
    glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true)
    ;
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"Initial",&local_5a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"Initial",(allocator<char> *)&pipeline.field_0xf);
    tcu::ScopedLogSection::ScopedLogSection(&local_580,pTVar9,&local_5a0,&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator((allocator<char> *)&pipeline.field_0xf);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
    pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramPipeline::ProgramPipeline((ProgramPipeline *)((long)&buf.field_2 + 8),pRVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&written,3,'X',&local_601);
    std::allocator<char>::~allocator(&local_601);
    local_608 = -1;
    dVar4 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)((long)&buf.field_2 + 8));
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              ((ResultCollector *)local_478,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               dVar4,0x8b84,0,QUERY_PIPELINE_INTEGER);
    dVar4 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)((long)&buf.field_2 + 8));
    infoLog = (GLchar *)std::__cxx11::string::operator[]((ulong)&written);
    glu::CallLogWrapper::glGetProgramPipelineInfoLog
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,2,&local_608,infoLog);
    GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar5,"query log",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x152);
    if (local_608 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_628,"\'length\' was not written to",&local_629);
      tcu::ResultCollector::fail((ResultCollector *)local_478,&local_628);
      std::__cxx11::string::~string((string *)&local_628);
      std::allocator<char>::~allocator(&local_629);
    }
    else if (local_608 == 0) {
      pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)&written);
      if (*pcVar10 == '\0') {
        pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)&written);
        if ((*pcVar10 != 'X') ||
           (pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)&written), *pcVar10 != 'X')) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6a0,"buffer after returned length modified",
                     (allocator<char> *)((long)&superSection.m_log + 7));
          tcu::ResultCollector::fail((ResultCollector *)local_478,&local_6a0);
          std::__cxx11::string::~string((string *)&local_6a0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&superSection.m_log + 7));
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_678,"log was not 0-sized null-terminated string",&local_679);
        tcu::ResultCollector::fail((ResultCollector *)local_478,&local_678);
        std::__cxx11::string::~string((string *)&local_678);
        std::allocator<char>::~allocator(&local_679);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,"\'length\' was not 0",&local_651);
      tcu::ResultCollector::fail((ResultCollector *)local_478,&local_650);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator(&local_651);
    }
    std::__cxx11::string::~string((string *)&written);
    glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)((long)&buf.field_2 + 8));
    tcu::ScopedLogSection::~ScopedLogSection(&local_580);
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d0,"ValidationFail",&local_6d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f8,"Failed validation",(allocator<char> *)&pipeline_1.field_0xf);
    tcu::ScopedLogSection::ScopedLogSection(&local_6b0,pTVar9,&local_6d0,&local_6f8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator((allocator<char> *)&pipeline_1.field_0xf);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::allocator<char>::~allocator(&local_6d1);
    pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramPipeline::ProgramPipeline((ProgramPipeline *)&logLen.m_value,pRVar7);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_71c);
    dVar4 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&logLen.m_value);
    glu::CallLogWrapper::glBindProgramPipeline
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4);
    dVar4 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&logLen.m_value);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,1,dVar6);
    dVar4 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&logLen.m_value);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e8);
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,2,dVar6);
    GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar5,"gen pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x166);
    glu::CallLogWrapper::glBindProgramPipeline
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0);
    GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar5,"unbind pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x169);
    dVar4 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&logLen.m_value);
    glu::CallLogWrapper::glValidateProgramPipeline
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4);
    GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar5,"gen pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x16b);
    dVar4 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&logLen.m_value);
    params = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                       ((StateQueryMemoryWriteGuard<int> *)local_71c);
    glu::CallLogWrapper::glGetProgramPipelineiv
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8b84,params);
    GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar5,"get INFO_LOG_LENGTH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x16e);
    bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int> *)local_71c,(ResultCollector *)local_478);
    if (bVar2) {
      puVar11 = (uint *)deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                                  ((StateQueryMemoryWriteGuard *)local_71c);
      uVar1 = *puVar11;
      dVar4 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&logLen.m_value);
      verifyInfoLogQuery((Functional *)local_478,
                         (ResultCollector *)((long)&result.m_message.field_2 + 8),
                         (CallLogWrapper *)(ulong)uVar1,dVar4,0x27d0cc0,0,
                         "glGetProgramPipelineInfoLog");
    }
    glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)&logLen.m_value);
    tcu::ScopedLogSection::~ScopedLogSection(&local_6b0);
    tcu::ResultCollector::setTestContextResult
              ((ResultCollector *)local_478,
               (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::ResultCollector::~ResultCollector((ResultCollector *)local_478);
    glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2e8);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
    return STOP;
  }
  section_2.m_log._6_1_ = 1;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"failed to build program",
             (allocator<char> *)((long)&section_2.m_log + 7));
  tcu::TestError::TestError(this_00,&local_570);
  section_2.m_log._6_1_ = 0;
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

InfoLogCase::IterateResult InfoLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	static const char* const s_incompatibleFragmentSource = "#version 310 es\n"
															"in mediump vec2 v_colorB;\n"
															"in mediump vec2 v_colorC;\n"
															"layout(location=0) out highp vec4 o_color;\n"
															"void main()\n"
															"{\n"
															"	o_color = v_colorB.xxyy + v_colorC.yyxy;\n"
															"}\n";

	glu::ShaderProgram		vtxProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::VertexSource(s_vertexSource));
	glu::ShaderProgram		frgProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::FragmentSource(s_incompatibleFragmentSource));
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "VtxProg", "Vertex program");
		m_testCtx.getLog() << vtxProgram;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "FrgProg", "Fragment program");
		m_testCtx.getLog() << frgProgram;
	}

	if (!vtxProgram.isOk() || !frgProgram.isOk())
		throw tcu::TestError("failed to build program");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Initial", "Initial");
		glu::ProgramPipeline		pipeline	(m_context.getRenderContext());
		std::string					buf			(3, 'X');
		int							written		= -1;

		verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), GL_INFO_LOG_LENGTH, 0, QUERY_PIPELINE_INTEGER);

		gl.glGetProgramPipelineInfoLog(pipeline.getPipeline(), 2, &written, &buf[0]);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query log");

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 0)
			result.fail("'length' was not 0");
		else if (buf[0] != '\0')
			result.fail("log was not 0-sized null-terminated string");
		else if (buf[1] != 'X' || buf[2] != 'X')
			result.fail("buffer after returned length modified");
	}

	{
		const tcu::ScopedLogSection				superSection	(m_testCtx.getLog(), "ValidationFail", "Failed validation");
		glu::ProgramPipeline					pipeline		(m_context.getRenderContext());
		StateQueryMemoryWriteGuard<glw::GLint>	logLen;

		gl.glBindProgramPipeline(pipeline.getPipeline());
		gl.glUseProgramStages(pipeline.getPipeline(), GL_VERTEX_SHADER_BIT, vtxProgram.getProgram());
		gl.glUseProgramStages(pipeline.getPipeline(), GL_FRAGMENT_SHADER_BIT, frgProgram.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");

		gl.glBindProgramPipeline(0);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "unbind pipeline");
		gl.glValidateProgramPipeline(pipeline.getPipeline());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");

		gl.glGetProgramPipelineiv(pipeline.getPipeline(), GL_INFO_LOG_LENGTH, &logLen);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "get INFO_LOG_LENGTH");

		if (logLen.verifyValidity(result))
			verifyInfoLogQuery(result, gl, logLen, pipeline.getPipeline(), &glu::CallLogWrapper::glGetProgramPipelineInfoLog, "glGetProgramPipelineInfoLog");
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}